

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

void __thiscall filesystem::path::set(path *this,string *str,path_type type)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  string tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenized;
  string local_78;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  pointer local_28;
  
  this->m_type = type;
  if (type != windows_path) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/","");
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38,str,&local_78);
    local_58._0_8_ =
         (this->m_path).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ =
         (this->m_path).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._16_8_ =
         (this->m_path).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_path).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38._M_allocated_capacity;
    (this->m_path).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
    (this->m_path).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    local_38._M_allocated_capacity = 0;
    local_38._8_8_ = 0;
    local_28 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (str->_M_string_length == 0) {
      bVar7 = false;
    }
    else {
      bVar7 = *(str->_M_dataplus)._M_p == '/';
    }
    this->m_absolute = bVar7;
    return;
  }
  pcVar2 = (str->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + str->_M_string_length);
  if ((set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                                   LONG_PATH_PREFIX_abi_cxx11_), iVar3 != 0)) {
    set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                   LONG_PATH_PREFIX_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &set(std::__cxx11::string_const&,filesystem::path::path_type)::
                LONG_PATH_PREFIX_abi_cxx11_,"\\\\?\\","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &set(std::__cxx11::string_const&,filesystem::path::path_type)::
                  LONG_PATH_PREFIX_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_);
  }
  if (set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
      _M_string_length <= local_78._M_string_length) {
    _Var5._M_p = set(std::__cxx11::string_const&,filesystem::path::path_type)::
                 LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p;
    if (set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
        _M_string_length != 0) {
      sVar6 = 0;
      do {
        if (set(std::__cxx11::string_const&,filesystem::path::path_type)::
            LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p[sVar6] != local_78._M_dataplus._M_p[sVar6])
        {
          _Var5._M_p = set(std::__cxx11::string_const&,filesystem::path::path_type)::
                       LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p + sVar6;
          break;
        }
        sVar6 = sVar6 + 1;
        _Var5._M_p = set(std::__cxx11::string_const&,filesystem::path::path_type)::
                     LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p +
                     set(std::__cxx11::string_const&,filesystem::path::path_type)::
                     LONG_PATH_PREFIX_abi_cxx11_._M_string_length;
      } while (set(std::__cxx11::string_const&,filesystem::path::path_type)::
               LONG_PATH_PREFIX_abi_cxx11_._M_string_length != sVar6);
    }
    if (_Var5._M_p ==
        set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
        _M_dataplus._M_p +
        set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
        _M_string_length) {
      std::__cxx11::string::erase((ulong)&local_78,0);
    }
  }
  _Var5._M_p = local_78._M_dataplus._M_p;
  if (((local_78._M_string_length < 2) || (*local_78._M_dataplus._M_p != '\\')) ||
     (local_78._M_dataplus._M_p[1] != '\\')) {
    if (((local_78._M_string_length < 4) || (*local_78._M_dataplus._M_p != 'U')) ||
       ((local_78._M_dataplus._M_p[1] != 'N' ||
        ((local_78._M_dataplus._M_p[2] != 'C' || (local_78._M_dataplus._M_p[3] != '\\')))))) {
      if ((((2 < local_78._M_string_length) &&
           (iVar3 = isalpha((int)*local_78._M_dataplus._M_p), iVar3 != 0)) && (_Var5._M_p[1] == ':')
          ) && ((cVar1 = _Var5._M_p[2], cVar1 == '\\' || (cVar1 == '/')))) {
        std::__cxx11::string::substr((ulong)local_58,(ulong)&local_78);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_path,local_58,&local_38);
        if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
        }
        std::__cxx11::string::erase((ulong)&local_78,0);
        this->m_absolute = true;
        this->m_smb = false;
        goto LAB_00457ce8;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_path,
                 0,0);
      goto LAB_00457ce2;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_path,0,
               0);
    std::__cxx11::string::erase((ulong)&local_78,0);
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_path,0,
               0);
    std::__cxx11::string::erase((ulong)&local_78,0);
    lVar4 = std::__cxx11::string::find_first_of((char *)&local_78,0x769efb,0);
    if (lVar4 == -1) {
LAB_00457ce2:
      this->m_absolute = false;
      this->m_smb = false;
      goto LAB_00457ce8;
    }
  }
  this->m_absolute = true;
  this->m_smb = true;
LAB_00457ce8:
  local_58._0_8_ = (pointer)(local_58 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"/\\","");
  tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_38,&local_78,(string *)local_58);
  if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_path,
             (this->m_path).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,local_38._M_allocated_capacity,
             local_38._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void set(const std::string &str, path_type type = native_path) {
        m_type = type;
        if (type == windows_path) {
            std::string tmp = str;

            // Long windows paths (sometimes) begin with the prefix \\?\. It should only
            // be used when the path is >MAX_PATH characters long, so we remove it
            // for convenience and add it back (if necessary) in str()/wstr().
            static const std::string LONG_PATH_PREFIX = "\\\\?\\";
            if (tmp.length() >= LONG_PATH_PREFIX.length()
             && std::mismatch(std::begin(LONG_PATH_PREFIX), std::end(LONG_PATH_PREFIX), std::begin(tmp)).first == std::end(LONG_PATH_PREFIX)) {
                tmp.erase(0, LONG_PATH_PREFIX.length());
            }

            // Special-case handling of absolute SMB paths, which start with the prefix "\\".
            if (tmp.length() >= 2 && tmp[0] == '\\' && tmp[1] == '\\') {
                m_path = {};
                tmp.erase(0, 2);

                // Interestingly, there is a special-special case where relative paths may be specified as beginning with a "\\"
                // when a non-SMB file with a more-than-260-characters-long absolute _local_ path is double-clicked. This seems to
                // only happen with single-segment relative paths, so we can check for this condition by making sure no further
                // path separators are present.
                if (tmp.find_first_of("/\\") != std::string::npos)
                    m_absolute = m_smb = true;
                else
                    m_absolute = m_smb = false;

            // Special-case handling of absolute SMB paths, which start with the prefix "UNC\"
            } else if (tmp.length() >= 4 && tmp[0] == 'U' && tmp[1] == 'N' && tmp[2] == 'C' && tmp[3] == '\\') {
                m_path = {};
                tmp.erase(0, 4);
                m_absolute = true;
                m_smb = true;
            // Special-case handling of absolute local paths, which start with the drive letter and a colon "X:\"
            } else if (tmp.length() >= 3 && std::isalpha(tmp[0]) && tmp[1] == ':' && (tmp[2] == '\\' || tmp[2] == '/')) {
                m_path = {tmp.substr(0, 2)};
                tmp.erase(0, 3);
                m_absolute = true;
                m_smb = false;
            // Relative path
            } else {
                m_path = {};
                m_absolute = false;
                m_smb = false;
            }

            std::vector<std::string> tokenized = tokenize(tmp, "/\\");
            m_path.insert(std::end(m_path), std::begin(tokenized), std::end(tokenized));
        } else {
            m_path = tokenize(str, "/");
            m_absolute = !str.empty() && str[0] == '/';
        }
    }